

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_reader.cc
# Opt level: O2

string * __thiscall
pstack::Dwarf::DWARFReader::readFormString_abi_cxx11_
          (string *__return_storage_ptr__,DWARFReader *this,Info *dwarf,Unit *unit,Form form)

{
  ostream *this_00;
  uintmax_t uVar1;
  Exception *this_01;
  undefined1 local_1c8 [416];
  
  if (form == DW_FORM_line_strp) {
    uVar1 = getuint(this,unit->dwarfLen);
    Elf::Section::io((Section *)local_1c8);
    (*(*(_func_int ***)local_1c8._0_8_)[7])(__return_storage_ptr__,local_1c8._0_8_,uVar1);
  }
  else {
    if (form != DW_FORM_strp) {
      if (form == DW_FORM_strx) {
        uVar1 = getuleb128(this);
        Unit::strx_abi_cxx11_(__return_storage_ptr__,unit,uVar1);
        return __return_storage_ptr__;
      }
      if (form == DW_FORM_string) {
        getstring_abi_cxx11_(__return_storage_ptr__,this);
        return __return_storage_ptr__;
      }
      this_01 = (Exception *)__cxa_allocate_exception(0x1a0);
      memset((Exception *)local_1c8,0,0x1a0);
      Exception::Exception((Exception *)local_1c8);
      this_00 = (ostream *)(local_1c8 + 8);
      std::operator<<(this_00,"unhandled form ");
      std::ostream::operator<<(this_00,form);
      std::operator<<(this_00," when reading string");
      Exception::Exception(this_01,(Exception *)local_1c8);
      __cxa_throw(this_01,&Exception::typeinfo,Exception::~Exception);
    }
    uVar1 = getuint(this,unit->dwarfLen);
    Elf::Section::io((Section *)local_1c8);
    (*(*(_func_int ***)local_1c8._0_8_)[7])(__return_storage_ptr__,local_1c8._0_8_,uVar1);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1c8 + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string
DWARFReader::readFormString(const Info &dwarf, Unit &unit, Form form)
{
    switch (form) {
        case DW_FORM_string:
            return getstring();
        case DW_FORM_line_strp: {
            auto off = getuint(unit.dwarfLen);
            return dwarf.debugLineStrings.io()->readString(off);
        }
        case DW_FORM_strp: {
            auto off = getuint(unit.dwarfLen);
            return dwarf.debugStrings.io()->readString(off);
        }
        case DW_FORM_strx: {
            size_t off = getuleb128();
            return unit.strx(off);
        }
        default: {
            throw (Exception() << "unhandled form " << form << " when reading string");
        }
    }
}